

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::createLocalVarDeclarationNode
          (Parser *this,Token *t,vector<Node_*,_std::allocator<Node_*>_> *var_keys,
          vector<Node_*,_std::allocator<Node_*>_> *optional_values)

{
  pointer *pppNVar1;
  Token *pTVar2;
  iterator iVar3;
  Node *this_00;
  Node *pNVar4;
  Node **__args;
  ulong uVar5;
  pointer ppNVar6;
  long lVar7;
  Node *declarator;
  Node *local_50;
  vector<Node*,std::allocator<Node*>> *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  Parser *local_38;
  
  local_40 = optional_values;
  this_00 = (Node *)operator_new(0x30);
  local_38 = this;
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = t;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_LOCAL_VAR_DECLARATION;
  ppNVar6 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppNVar6) {
    local_48 = (vector<Node*,std::allocator<Node*>> *)&this_00->children;
    lVar7 = 0;
    uVar5 = 0;
    do {
      pNVar4 = (Node *)operator_new(0x30);
      pTVar2 = ppNVar6[uVar5]->tok;
      CompilationContext::Poolable::Poolable((Poolable *)pNVar4,local_38->ctx);
      pNVar4->tok = pTVar2;
      (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar4->nodeType = PNT_UNKNOWN;
      pNVar4->nodeType = PNT_VAR_DECLARATOR;
      __args = (Node **)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar7);
      iVar3._M_current =
           (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_50 = pNVar4;
      if (iVar3._M_current ==
          (pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&pNVar4->children,iVar3,__args);
      }
      else {
        *iVar3._M_current = *__args;
        pppNVar1 = &(pNVar4->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      ppNVar6 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar4 = *(Node **)((long)ppNVar6 + lVar7);
      if (pNVar4 != (Node *)0x0) {
        iVar3._M_current =
             (local_50->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_50->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_50->children,iVar3,
                     (Node **)((long)ppNVar6 + lVar7));
        }
        else {
          *iVar3._M_current = pNVar4;
          pppNVar1 = &(local_50->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      iVar3._M_current =
           (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  (local_48,iVar3,&local_50);
      }
      else {
        *iVar3._M_current = local_50;
        pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      ppNVar6 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 8;
    } while (uVar5 < (ulong)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3));
  }
  return this_00;
}

Assistant:

Node * createLocalVarDeclarationNode(Token & t, vector<Node *> var_keys, vector<Node *> optional_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      if (optional_values[i])
        declarator->children.push_back(optional_values[i]);
      n->children.push_back(declarator);
    }

    return n;
  }